

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudio_RegisterForCallbacks(FAudio *audio,FAudioEngineCallback *pCallback)

{
  LinkedList_AddEntry(&audio->callbacks,pCallback,audio->callbackLock,audio->pMalloc);
  return 0;
}

Assistant:

uint32_t FAudio_RegisterForCallbacks(
	FAudio *audio,
	FAudioEngineCallback *pCallback
) {
	LOG_API_ENTER(audio)
	LinkedList_AddEntry(
		&audio->callbacks,
		pCallback,
		audio->callbackLock,
		audio->pMalloc
	);
	LOG_API_EXIT(audio)
	return 0;
}